

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O3

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats,RTCFeatureFlags feature_mask)

{
  ISPCMaterial *pIVar1;
  ulong uVar2;
  ISPCOBJMaterial *material;
  uint uVar3;
  undefined1 auVar4 [12];
  float fVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar12;
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined1 local_e8 [12];
  float fStack_dc;
  float fStack_d8;
  uint local_d4;
  uint uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  DifferentialGeometry local_b8;
  undefined1 auVar13 [16];
  
  if (data->motion_blur == true) {
    uVar3 = y << 0x10 | x;
    uVar3 = uVar3 * -0x3361d2af >> 0x11 | uVar3 * 0x16a88000;
    uVar3 = (uVar3 * -0x194da000 | uVar3 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar3 = (uVar3 * 0x2000 | uVar3 >> 0x13) * 5 + 0xe6546b64;
    uVar3 = (uVar3 >> 0x10 ^ uVar3) * -0x7a143595;
    uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
    time = (float)((uVar3 >> 0x10 ^ uVar3) * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
  }
  fVar5 = (float)x;
  fVar8 = (float)y;
  local_108 = (camera->xfm).l.vz.field_0.field_0.x +
              fVar8 * (camera->xfm).l.vy.field_0.field_0.x +
              fVar5 * (camera->xfm).l.vx.field_0.field_0.x;
  fStack_104 = (camera->xfm).l.vz.field_0.field_0.y +
               fVar8 * (camera->xfm).l.vy.field_0.field_0.y +
               fVar5 * (camera->xfm).l.vx.field_0.field_0.y;
  fVar7 = (camera->xfm).l.vz.field_0.field_0.z +
          fVar8 * (camera->xfm).l.vy.field_0.field_0.z +
          fVar5 * (camera->xfm).l.vx.field_0.field_0.z;
  fVar5 = fVar8 * 0.0 + fVar5 * 0.0 + 0.0;
  fVar8 = fStack_104 * fStack_104;
  fVar11 = fVar7 * fVar7;
  fVar5 = fVar5 * fVar5;
  fVar12 = fVar8 + local_108 * local_108 + fVar11;
  auVar13._0_8_ = CONCAT44(fVar8 + fVar8 + fVar5,fVar12);
  auVar13._8_4_ = fVar8 + fVar11 + fVar11;
  auVar13._12_4_ = fVar8 + fVar5 + fVar5;
  auVar9._8_4_ = auVar13._8_4_;
  auVar9._0_8_ = auVar13._0_8_;
  auVar9._12_4_ = auVar13._12_4_;
  auVar9 = rsqrtss(auVar9,auVar13);
  fVar5 = auVar9._0_4_;
  fStack_100 = fVar5 * fVar5 * fVar12 * -0.5 * fVar5 + fVar5 * 1.5;
  local_108 = fStack_100 * local_108;
  fStack_104 = fStack_100 * fStack_104;
  fStack_100 = fStack_100 * fVar7;
  local_118.m128[2] =
       (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_118._0_8_ = *(undefined8 *)&(camera->xfm).p.field_0;
  local_118.m128[3] = 0.0;
  local_f8 = 0xffffffff7f800000;
  local_d4 = 0xffffffff;
  uStack_d0 = 0xffffffff;
  uStack_cc = 0xffffffff;
  uStack_c8 = 0xffffffff;
  fStack_fc = time;
  rtcTraversableIntersect1(data->traversable,&local_118);
  stats->numRays = stats->numRays + 1;
  if (uStack_d0 == 0xffffffff) {
    pixels[width * y + x] = 0;
  }
  else {
    local_b8.geomID = uStack_d0;
    local_b8.primID = local_d4;
    local_b8.P.field_0.m128[0] = (float)local_f8 * local_108 + local_118.m128[0];
    local_b8.P.field_0.m128[1] = (float)local_f8 * fStack_104 + local_118.m128[1];
    local_b8.P.field_0.m128[2] = (float)local_f8 * fStack_100 + local_118.m128[2];
    local_b8.P.field_0.m128[3] = (float)local_f8 * fStack_fc + local_118.m128[3];
    local_b8.u = fStack_dc;
    local_b8.v = fStack_d8;
    local_b8.Ng.field_0.m128[3] = 0.0;
    local_b8.Ng.field_0._0_4_ = (float)local_e8._0_4_;
    local_b8.Ng.field_0._4_4_ = (float)local_e8._4_4_;
    local_b8.Ng.field_0._8_4_ = (float)local_e8._8_4_;
    local_b8.Ns.field_0.m128[3] = 0.0;
    local_b8.Ns.field_0.m128[0] = (float)local_e8._0_4_;
    local_b8.Ns.field_0.m128[1] = (float)local_e8._4_4_;
    local_b8.Ns.field_0.m128[2] = (float)local_e8._8_4_;
    uVar3 = postIntersect(data,(Ray *)&local_118.field_1,&local_b8);
    fVar5 = local_b8.Ns.field_0.m128[1] * local_b8.Ns.field_0.m128[1];
    fVar7 = local_b8.Ns.field_0.m128[2] * local_b8.Ns.field_0.m128[2];
    fVar8 = local_b8.Ns.field_0.m128[3] * local_b8.Ns.field_0.m128[3];
    fVar11 = fVar5 + local_b8.Ns.field_0.m128[0] * local_b8.Ns.field_0.m128[0] + fVar7;
    auVar10._0_8_ = CONCAT44(fVar5 + fVar5 + fVar8,fVar11);
    auVar10._8_4_ = fVar5 + fVar7 + fVar7;
    auVar10._12_4_ = fVar5 + fVar8 + fVar8;
    auVar14._8_4_ = auVar10._8_4_;
    auVar14._0_8_ = auVar10._0_8_;
    auVar14._12_4_ = auVar10._12_4_;
    auVar9 = rsqrtss(auVar14,auVar10);
    fVar5 = auVar9._0_4_;
    fVar5 = fVar5 * 1.5 - fVar5 * fVar5 * fVar11 * 0.5 * fVar5;
    auVar4._0_4_ = fVar5 * local_b8.Ns.field_0.m128[0];
    auVar4._4_4_ = fVar5 * local_b8.Ns.field_0.m128[1];
    auVar4._8_4_ = fVar5 * local_b8.Ns.field_0.m128[2];
    if (0.0 <= fStack_100 * auVar4._8_4_ + fStack_104 * auVar4._4_4_ + local_108 * auVar4._0_4_) {
      uVar2 = CONCAT44(auVar4._4_4_,auVar4._0_4_);
      auVar4._0_8_ = uVar2 ^ 0x8000000080000000;
      auVar4._8_4_ = -auVar4._8_4_;
    }
    pIVar1 = data->ispc_scene->materials[(int)uVar3];
    if (pIVar1->type == 0) {
      uVar6._0_4_ = pIVar1[3].type;
      uVar6._4_4_ = pIVar1[3].align[0];
      fVar5 = (float)*(undefined8 *)(pIVar1[3].align + 1);
    }
    else {
      uVar6 = 0x3f0000003f000000;
      fVar5 = 0.5;
    }
    fVar8 = auVar4._8_4_ * -fStack_100 + auVar4._4_4_ * -fStack_104 + auVar4._0_4_ * -local_108;
    fVar7 = fVar8 * (float)uVar6;
    fVar11 = fVar8 * (float)((ulong)uVar6 >> 0x20);
    fVar8 = fVar8 * fVar5;
    if (1.0 <= fVar7) {
      fVar7 = 1.0;
    }
    fVar5 = 0.0;
    if (0.0 <= fVar7) {
      fVar5 = fVar7;
    }
    if (1.0 <= fVar11) {
      fVar11 = 1.0;
    }
    fVar7 = 0.0;
    if (0.0 <= fVar11) {
      fVar7 = fVar11;
    }
    if (1.0 <= fVar8) {
      fVar8 = 1.0;
    }
    fVar11 = 0.0;
    if (0.0 <= fVar8) {
      fVar11 = fVar8;
    }
    pixels[width * y + x] =
         (int)(long)(fVar7 * 255.0) * 0x100 + (int)(long)(fVar5 * 255.0) +
         (int)(long)(fVar11 * 255.0) * 0x10000;
  }
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera,
                         RayStats& stats,
                         const RTCFeatureFlags feature_mask)
{
  /* initialize sampler */
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, 0);

  /* initialize ray */
  float ray_time = data.motion_blur ? RandomSampler_get1D(sampler) : time;
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf, ray_time);

  /* intersect ray with scene */
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.flags = data.iflags_coherent;
#if RTC_MIN_WIDTH
  args.minWidthDistanceFactor = 0.5f*data.min_width/width;
#endif
  args.feature_mask = feature_mask;
  
  rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  RayStats_addRay(stats);

  /* shade background black */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) {
    pixels[y*width+x] = 0;
    return;
  }

  /* shade all rays that hit something */
  Vec3fa color = Vec3fa(0.5f);

  /* compute differential geometry */
  DifferentialGeometry dg;
  dg.geomID = ray.geomID;
  dg.primID = ray.primID;
  dg.u = ray.u;
  dg.v = ray.v;
  dg.P  = ray.org+ray.tfar*ray.dir;
  dg.Ng = ray.Ng;
  dg.Ns = ray.Ng;

#if 0
  if (data.use_smooth_normals)
    if (ray.geomID != RTC_INVALID_GEOMETRY_ID) // FIXME: workaround for ISPC bug, location reached with empty execution mask
    {
      Vec3fa dPdu,dPdv;
      auto geomID = ray.geomID; {
        rtcInterpolate1(rtcGetGeometry(data.scene,geomID),ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX,0,nullptr,&dPdu.x,&dPdv.x,3);
      }
      dg.Ns = cross(dPdv,dPdu);
    }
#endif

  int materialID = postIntersect(data,ray,dg);
  dg.Ng = face_forward(ray.dir,normalize(dg.Ng));
  dg.Ns = face_forward(ray.dir,normalize(dg.Ns));

  /* shade */
  if (data.ispc_scene->materials[materialID]->type == MATERIAL_OBJ) {
    ISPCOBJMaterial* material = (ISPCOBJMaterial*) data.ispc_scene->materials[materialID];
    color = Vec3fa(material->Kd);
  }

  color = color*dot(neg(ray.dir),dg.Ns);

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}